

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

bool __thiscall
ddd::DaTrie<false,_false,_false>::search_key(DaTrie<false,_false,_false> *this,Query *query)

{
  pointer pBVar1;
  pointer pcVar2;
  uint uVar3;
  Bc BVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  uint32_t uVar9;
  bool bVar10;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar4 = pBVar1[query->node_pos_];
  uVar3 = BVar4._0_4_;
  if (-1 < (int)uVar3) {
    uVar7 = (ulong)query->node_pos_;
    uVar9 = query->pos_;
    do {
      uVar5 = (uint)(byte)query->key_[uVar9] ^ BVar4._0_4_;
      if ((*(uint *)&pBVar1[uVar5].field_0x4 & 0x7fffffff) != (uint)uVar7) {
        return false;
      }
      query->node_pos_ = uVar5;
      query->pos_ = uVar9 + 1;
      query->is_finished_ = query->key_[uVar9] == '\0';
      BVar4 = pBVar1[uVar5];
      uVar3 = BVar4._0_4_;
      uVar7 = (ulong)uVar5;
      uVar9 = uVar9 + 1;
    } while (-1 < (int)uVar3);
  }
  if (query->is_finished_ == true) {
    uVar3 = uVar3 & 0x7fffffff;
    bVar10 = true;
  }
  else {
    uVar3 = uVar3 & 0x7fffffff;
    pcVar2 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar8 = query->key_[query->pos_];
    if (cVar8 == '\0') {
      uVar5 = 1;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (cVar8 != pcVar2[uVar7 + uVar3]) {
          bVar10 = false;
          goto LAB_00115e8e;
        }
        iVar6 = (int)uVar7;
        uVar7 = (ulong)(iVar6 + 1);
        cVar8 = query->key_[uVar7 + query->pos_];
      } while (cVar8 != '\0');
      uVar5 = iVar6 + 2;
    }
    bVar10 = pcVar2[uVar7 + uVar3] == '\0';
    if (bVar10) {
      uVar7 = (ulong)uVar5;
    }
LAB_00115e8e:
    if (bVar10 == false) {
      return false;
    }
    uVar3 = *(uint *)(pcVar2 + uVar7 + uVar3);
  }
  query->value_ = uVar3;
  return bVar10;
}

Assistant:

bool search_key(Query& query) const {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    while (!bc_[query.node_pos()].is_leaf()) {
      auto child_pos = bc_[query.node_pos()].base() ^query.label();
      if (bc_[child_pos].check() != query.node_pos()) {
        return false;
      }
      query.next(child_pos);
    }

    auto value = bc_[query.node_pos()].value();
    if (query.is_finished()) {
      query.set_value(value);
      return true;
    }

    uint32_t len = 0;
    auto tail = tail_.data() + value;
    if (!utils::match(query.key(), tail, len)) {
      return false;
    }
    query.set_value(utils::extract_value(tail + len));
    return true;
  }